

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_util.h
# Opt level: O2

void google::protobuf::
     STLDeleteContainerPointers<__gnu_cxx::__normal_iterator<google::protobuf::FileDescriptorTables**,std::vector<google::protobuf::FileDescriptorTables*,std::allocator<google::protobuf::FileDescriptorTables*>>>>
               (__normal_iterator<google::protobuf::FileDescriptorTables_**,_std::vector<google::protobuf::FileDescriptorTables_*,_std::allocator<google::protobuf::FileDescriptorTables_*>_>_>
                begin,__normal_iterator<google::protobuf::FileDescriptorTables_**,_std::vector<google::protobuf::FileDescriptorTables_*,_std::allocator<google::protobuf::FileDescriptorTables_*>_>_>
                      end)

{
  FileDescriptorTables *this;
  
  for (; begin._M_current != end._M_current; begin._M_current = begin._M_current + 1) {
    this = *begin._M_current;
    if (this != (FileDescriptorTables *)0x0) {
      FileDescriptorTables::~FileDescriptorTables(this);
    }
    operator_delete(this,0x198);
  }
  return;
}

Assistant:

void STLDeleteContainerPointers(ForwardIterator begin,
                                ForwardIterator end) {
  while (begin != end) {
    ForwardIterator temp = begin;
    ++begin;
    delete *temp;
  }
}